

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

void __thiscall Js::SourceTextModuleRecord::InitializeIndirectExports(SourceTextModuleRecord *this)

{
  Type *addr;
  IdentPtr pIVar1;
  IdentPtr pIVar2;
  IdentPtr pIVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  SourceTextModuleRecord *pSVar10;
  JavascriptError *pError;
  ScriptContext *scriptContext;
  PCWSTR specifier;
  HRESULT hr;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar11;
  Iterator local_48;
  long local_38;
  ModuleNameRecord *exportRecord;
  
  local_38 = 0;
  pSVar11 = (this->indirectExportRecordList).ptr;
  if (pSVar11 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    local_48.list =
         &pSVar11->super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
    local_48.current = (NodeBase *)pSVar11;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    addr = &this->errorObject;
LAB_00b0622e:
    if (pSVar11 == (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
      pSVar11 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                local_48.current;
    }
    local_48.current =
         (pSVar11->super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>).
         super_SListNodeBase<Memory::ArenaAllocator>.next;
    if ((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_48.current
        != local_48.list) {
      pTVar9 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data(&local_48);
      pIVar1 = pTVar9->moduleRequest;
      pIVar2 = pTVar9->importName;
      pIVar3 = pTVar9->exportName;
      uVar6 = pIVar2->m_propertyId;
      if (uVar6 == 0xffffffff) {
        uVar6 = ScriptContext::GetOrAddPropertyIdTracked
                          ((this->scriptContext).ptr,(LPCWSTR)&pIVar2->field_0x22,pIVar2->m_cch);
        pIVar2->m_propertyId = uVar6;
      }
      specifier = (PCWSTR)&pIVar1->field_0x22;
      pSVar10 = GetChildModuleRecord(this,specifier);
      if (pSVar10 != (SourceTextModuleRecord *)0x0) goto code_r0x00b062dd;
      pError = JavascriptLibrary::CreateReferenceError
                         ((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary);
      scriptContext = (this->scriptContext).ptr;
      hr = -0x7ff5e9f2;
      goto LAB_00b06345;
    }
  }
  return;
code_r0x00b062dd:
  pSVar11 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
  if ((uVar6 != 0x70) &&
     ((iVar7 = (*(pSVar10->super_ModuleRecordBase).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                         (pSVar10,(ulong)uVar6,0,&local_38), (char)iVar7 == '\0' ||
      (pSVar11 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                 local_48.current, local_38 == 0)))) {
    pError = JavascriptLibrary::CreateSyntaxError
                       ((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary);
    specifier = (PCWSTR)&pIVar3->field_0x22;
    scriptContext = (this->scriptContext).ptr;
    hr = -0x7ff5e9f5;
LAB_00b06345:
    JavascriptError::SetErrorMessage(pError,hr,specifier,scriptContext);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pError;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pSVar11 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
              local_48.current;
  }
  goto LAB_00b0622e;
}

Assistant:

void SourceTextModuleRecord::InitializeIndirectExports()
    {
        ModuleNameRecord* exportRecord = nullptr;
        if (indirectExportRecordList != nullptr)
        {
            indirectExportRecordList->Map([&](ModuleImportOrExportEntry exportEntry)
            {
                PropertyId propertyId = EnsurePropertyIdForIdentifier(exportEntry.importName);
                SourceTextModuleRecord* childModuleRecord = GetChildModuleRecord(exportEntry.moduleRequest->Psz());
                if (childModuleRecord == nullptr)
                {
                    JavascriptError* errorObj = scriptContext->GetLibrary()->CreateReferenceError();
                    JavascriptError::SetErrorMessage(errorObj, JSERR_CannotResolveModule, exportEntry.moduleRequest->Psz(), scriptContext);
                    this->errorObject = errorObj;
                    return;
                }
                if (propertyId != PropertyIds::star_ &&
                    (!childModuleRecord->ResolveExport(propertyId, nullptr, &exportRecord) ||
                    (exportRecord == nullptr)))
                {
                    JavascriptError* errorObj = scriptContext->GetLibrary()->CreateSyntaxError();
                    JavascriptError::SetErrorMessage(errorObj, JSERR_ModuleResolveExport, exportEntry.exportName->Psz(), scriptContext);
                    this->errorObject = errorObj;
                    return;
                }
            });
        }
    }